

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t_conflict *context)

{
  anon_enum_32 aVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  char *dice_string;
  anon_union_8_5_62f3dbed_for_which aVar5;
  int iVar6;
  wchar_t wVar7;
  player *ppVar8;
  wchar_t radius;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  
  uVar3 = Rand_div(3);
  if (-4 < (int)uVar3) {
    iVar6 = uVar3 + 5;
    do {
      if (context->obj->pval * 2 < (player->state).skills[3]) {
        uVar3 = Rand_div(6);
        ppVar8 = player;
        if (uVar3 == 0) {
          wVar4 = damroll(5,0x14);
          take_hit(ppVar8,wVar4,"a chest dispel-player trap");
        }
        else {
          uVar3 = Rand_div(5);
          if (uVar3 == 0) {
            wVar7 = L'\b';
            wVar4 = L'È';
            ppVar8 = player;
          }
          else {
            uVar3 = Rand_div(4);
            if (uVar3 != 0) {
              uVar3 = Rand_div(3);
              if (uVar3 == 0) {
                aVar1 = (context->origin).what;
                aVar5 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                wVar4 = L'0';
                dice_string = "0";
                wVar7 = L'\0';
                radius = L'\0';
              }
              else {
                uVar3 = Rand_div(2);
                if (uVar3 == 0) {
                  origin._4_4_ = 0;
                  origin.what = (context->origin).what;
                  origin.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_00._4_4_ = 0;
                  origin_00.what = (context->origin).what;
                  origin_00.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_01._4_4_ = 0;
                  origin_01.what = (context->origin).what;
                  origin_01.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_02._4_4_ = 0;
                  origin_02.what = (context->origin).what;
                  origin_02.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  aVar1 = (context->origin).what;
                  aVar5 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                  wVar4 = L'\x11';
                  dice_string = "0";
                  wVar7 = L'\x04';
                  radius = L'\0';
                }
                else {
                  aVar1 = (context->origin).what;
                  aVar5 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                  wVar4 = L'M';
                  dice_string = "150";
                  wVar7 = L'\n';
                  radius = L'\x01';
                }
              }
              origin_03._4_4_ = 0;
              origin_03.what = aVar1;
              origin_03.which.trap = aVar5.trap;
              effect_simple(wVar4,origin_03,dice_string,wVar7,radius,L'\0',L'\0',L'\0',(_Bool *)0x0)
              ;
              goto LAB_00142923;
            }
            _Var2 = player_of_has(player,L'\x0f');
            ppVar8 = player;
            if (_Var2) {
              uVar3 = Rand_div(100);
              wVar4 = uVar3 + L'\n';
              wVar7 = L'\t';
            }
            else {
              uVar3 = Rand_div(6);
              wVar4 = uVar3 + L'\x02';
              wVar7 = L'\x03';
            }
          }
          player_inc_timed(ppVar8,wVar7,wVar4,true,true,true);
        }
      }
LAB_00142923:
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return false;
}

Assistant:

bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t *context)
{
	/* Determine how many nasty tricks can be played. */
	int nasty_tricks_count = 4 + randint0(3);

	/* This is gonna hurt... */
	for (; nasty_tricks_count > 0; nasty_tricks_count--) {
		/* ...but a high saving throw does help a little. */
		if (2 * context->obj->pval < player->state.skills[SKILL_SAVE]) {
			if (one_in_(6)) {
				take_hit(player, damroll(5, 20), "a chest dispel-player trap");
			} else if (one_in_(5)) {
				player_inc_timed(player, TMD_CUT, 200, true, true, true);
			} else if (one_in_(4)) {
				if (!player_of_has(player, OF_FREE_ACT)) {
					player_inc_timed(player, TMD_PARALYZED, 2 + randint0(6),
									 true, true, true);
				} else {
					player_inc_timed(player, TMD_STUN, 10 + randint0(100),
									 true, true, true);
				}
			} else if (one_in_(3)) {
				effect_simple(EF_DISENCHANT, context->origin, "0", 0, 0, 0, 0, 0, NULL);
			} else if (one_in_(2)) {
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_STR, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_INT, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_WIS, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_DEX, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_CON, 0, 0, 0, 0, NULL);
			} else {
				effect_simple(EF_CLOUD, context->origin, "150", PROJ_NETHER, 1, 0, 0, 0, NULL);
			}
		}
	}

	return false;
}